

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::image_type_glsl_abi_cxx11_(CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *pSVar4;
  CompilerError *pCVar5;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  SPIRType *type_00;
  char *pcVar6;
  char *local_300;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  SPIRType sampled_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string res;
  SPIRType *imagetype;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  type_00 = (SPIRType *)CONCAT44(in_register_00000014,id);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->image);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar3);
  ::std::__cxx11::string::string(local_50);
  iVar1 = *(int *)&(pSVar4->super_IVariant).field_0xc;
  if (iVar1 == 3) {
LAB_00392946:
    ::std::__cxx11::string::operator=(local_50,"i");
  }
  else {
    if (iVar1 != 4) {
      if (iVar1 == 5) goto LAB_00392946;
      if (iVar1 != 6) {
        if (iVar1 == 7) goto LAB_00392946;
        if (iVar1 != 8) goto LAB_00392981;
      }
    }
    ::std::__cxx11::string::operator=(local_50,"u");
  }
LAB_00392981:
  if (((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
      ((type_00->image).dim == DimSubpassData)) && ((type[0x16].image.depth & 1U) != 0)) {
    ::std::operator+(local_80,(char *)local_50);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  else if (((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
           ((type_00->image).dim == DimSubpassData)) &&
          (bVar2 = subpass_input_is_framebuffer_fetch((CompilerGLSL *)type,in_ECX), bVar2)) {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->image);
    pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar3);
    SPIRType::SPIRType((SPIRType *)local_1d8,pSVar4);
    sampled_type.super_IVariant._12_4_ = 4;
    (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,local_1d8,0);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
    SPIRType::~SPIRType((SPIRType *)local_1d8);
  }
  else {
    if ((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
       ((type_00->image).dim != DimSubpassData)) {
      if (((type_00->image).dim == DimBuffer) && ((type_00->image).sampled == 1)) {
        ::std::__cxx11::string::operator+=(local_50,"sampler");
      }
      else {
        pcVar6 = "texture";
        if ((type_00->image).sampled == 2) {
          pcVar6 = "image";
        }
        ::std::__cxx11::string::operator+=(local_50,pcVar6);
      }
    }
    else {
      ::std::__cxx11::string::operator+=(local_50,"sampler");
    }
    switch((type_00->image).dim) {
    case Dim1D:
      if ((type[0x16].image.type.id & 1) == 0) {
        local_300 = "iimage1D";
      }
      else {
        local_300 = "iimage2D";
      }
      local_300 = local_300 + 6;
      ::std::__cxx11::string::operator+=(local_50,local_300);
      break;
    case Dim2D:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=(local_50,"3D");
      break;
    case DimCube:
      ::std::__cxx11::string::operator+=(local_50,"Cube");
      break;
    case DimRect:
      if ((type[0x16].image.type.id & 1) != 0) {
        local_1fa = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1f8,"Rectangle textures are not supported on OpenGL ES.",&local_1f9);
        CompilerError::CompilerError(pCVar5,(string *)local_1f8);
        local_1fa = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar2 = is_legacy_desktop((CompilerGLSL *)type);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_220,"GL_ARB_texture_rectangle",&local_221);
        require_extension_internal((CompilerGLSL *)type,(string *)local_220);
        ::std::__cxx11::string::~string(local_220);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
      }
      ::std::__cxx11::string::operator+=(local_50,"2DRect");
      break;
    case DimBuffer:
      if (((type[0x16].image.type.id & 1) == 0) ||
         (0x13f < *(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char +
                           0x1c))) {
        if (((type[0x16].image.type.id & 1) == 0) &&
           (*(uint *)(type[0x16].member_type_index_redirection.stack_storage.aligned_char + 0x1c) <
            300)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_270,"GL_EXT_texture_buffer_object",&local_271);
          require_extension_internal((CompilerGLSL *)type,(string *)local_270);
          ::std::__cxx11::string::~string(local_270);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_271);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_248,"GL_EXT_texture_buffer",&local_249);
        require_extension_internal((CompilerGLSL *)type,(string *)local_248);
        ::std::__cxx11::string::~string(local_248);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
      }
      ::std::__cxx11::string::operator+=(local_50,"Buffer");
      break;
    case DimSubpassData:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    default:
      local_29a = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_298,
                 "Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.",
                 &local_299);
      CompilerError::CompilerError(pCVar5,(string *)local_298);
      local_29a = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((type_00->image).ms & 1U) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"MS");
    }
    if (((type_00->image).arrayed & 1U) != 0) {
      bVar2 = is_legacy_desktop((CompilerGLSL *)type);
      if (bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2c0,"GL_EXT_texture_array",&local_2c1);
        require_extension_internal((CompilerGLSL *)type,(string *)local_2c0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      }
      ::std::__cxx11::string::operator+=(local_50,"Array");
    }
    if (((*(int *)&(type_00->super_IVariant).field_0xc == 0x11) ||
        (*(int *)&(type_00->super_IVariant).field_0xc == 0x12)) &&
       (bVar2 = Compiler::is_depth_image((Compiler *)type,type_00,in_ECX), bVar2)) {
      ::std::__cxx11::string::operator+=(local_50,"Shadow");
    }
    ::std::__cxx11::string::string((string *)this,local_50);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerGLSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
	case SPIRType::Short:
	case SPIRType::SByte:
		res = "i";
		break;
	case SPIRType::UInt:
	case SPIRType::UShort:
	case SPIRType::UByte:
		res = "u";
		break;
	default:
		break;
	}

	// For half image types, we will force mediump for the sampler, and cast to f16 after any sampling operation.
	// We cannot express a true half texture type in GLSL. Neither for short integer formats for that matter.

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData && options.vulkan_semantics)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");
	else if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
	         subpass_input_is_framebuffer_fetch(id))
	{
		SPIRType sampled_type = get<SPIRType>(type.image.type);
		sampled_type.vecsize = 4;
		return type_to_glsl(sampled_type);
	}

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		// ES doesn't support 1D. Fake it with 2D.
		res += options.es ? "2D" : "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "Cube";
		break;
	case DimRect:
		if (options.es)
			SPIRV_CROSS_THROW("Rectangle textures are not supported on OpenGL ES.");

		if (is_legacy_desktop())
			require_extension_internal("GL_ARB_texture_rectangle");

		res += "2DRect";
		break;

	case DimBuffer:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_texture_buffer");
		else if (!options.es && options.version < 300)
			require_extension_internal("GL_EXT_texture_buffer_object");
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
	{
		if (is_legacy_desktop())
			require_extension_internal("GL_EXT_texture_array");
		res += "Array";
	}

	// "Shadow" state in GLSL only exists for samplers and combined image samplers.
	if (((type.basetype == SPIRType::SampledImage) || (type.basetype == SPIRType::Sampler)) &&
	    is_depth_image(type, id))
	{
		res += "Shadow";
	}

	return res;
}